

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O1

boolean place_level(int proto_index,proto_dungeon *pd)

{
  char cVar1;
  s_level *psVar2;
  int iVar3;
  boolean bVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  s_level *lev;
  long lVar9;
  int start;
  boolean map [33];
  uint local_5c;
  char local_58 [88];
  
  while( true ) {
    if (pd->n_levs == proto_index) {
      return '\x01';
    }
    lVar9 = (long)proto_index;
    psVar2 = pd->final_lev[lVar9];
    if (psVar2 != (s_level *)0x0) break;
    proto_index = proto_index + 1;
  }
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_58[0x14] = '\0';
  local_58[0x15] = '\0';
  local_58[0x16] = '\0';
  local_58[0x17] = '\0';
  local_58[0x18] = '\0';
  local_58[0x19] = '\0';
  local_58[0x1a] = '\0';
  local_58[0x1b] = '\0';
  local_58[0x1c] = '\0';
  local_58[0x1d] = '\0';
  local_58[0x1e] = '\0';
  local_58[0x1f] = '\0';
  local_58[0x20] = 0;
  iVar5 = level_range((psVar2->dlevel).dnum,(int)pd->tmplevel[lVar9].lev.base,
                      (int)pd->tmplevel[lVar9].lev.rand,pd->tmplevel[lVar9].chain,pd,
                      (int *)&local_5c);
  if (0 < iVar5) {
    iVar3 = local_5c + 1;
    if ((int)(local_5c + 1) < (int)(local_5c + iVar5)) {
      iVar3 = local_5c + iVar5;
    }
    memset(local_58 + (int)local_5c,1,(ulong)(~local_5c + iVar3) + 1);
  }
  lVar7 = (long)pd->start;
  if (pd->start < proto_index) {
    do {
      if ((pd->final_lev[lVar7] != (s_level *)0x0) &&
         (cVar1 = (pd->final_lev[lVar7]->dlevel).dlevel, local_58[cVar1] != '\0')) {
        local_58[cVar1] = '\0';
        iVar5 = iVar5 + -1;
      }
      lVar7 = lVar7 + 1;
    } while (lVar9 != lVar7);
  }
  if (iVar5 != 0) {
    lVar9 = (long)iVar5;
    do {
      uVar6 = mt_random();
      uVar8 = SUB168(ZEXT416(uVar6) % SEXT816(lVar9),0);
      lVar7 = 1;
      while ((local_58[lVar7] == '\0' ||
             (iVar5 = (int)uVar8, uVar8 = (ulong)(iVar5 - 1), iVar5 != 0))) {
        lVar7 = lVar7 + 1;
        if (lVar7 == 0x21) {
          panic("pick_level:  ran out of valid levels");
        }
      }
      (psVar2->dlevel).dlevel = (xchar)lVar7;
      bVar4 = place_level(proto_index + 1,pd);
      if (bVar4 != '\0') {
        return '\x01';
      }
      local_58[(psVar2->dlevel).dlevel] = '\0';
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  return '\0';
}

Assistant:

static boolean place_level(int proto_index, struct proto_dungeon *pd)
{
    boolean map[MAXLEVEL+1];	/* valid levels are 1..MAXLEVEL inclusive */
    s_level *lev;
    int npossible;

    if (proto_index == pd->n_levs) return TRUE;	/* at end of proto levels */

    lev = pd->final_lev[proto_index];

    /* No level created for this prototype, goto next. */
    if (!lev) return place_level(proto_index+1, pd);

    npossible = possible_places(proto_index, map, pd);

    for (; npossible; --npossible) {
	lev->dlevel.dlevel = pick_level(map, rn2(npossible));
	if (place_level(proto_index+1, pd))
	    return TRUE;

	map[lev->dlevel.dlevel] = FALSE;	/* this choice didn't work */
    }
    return FALSE;
}